

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

arg_date *
arg_daten(char *shortopts,char *longopts,char *format,char *datatype,int mincount,int maxcount,
         char *glossary)

{
  arg_date *paVar1;
  char *pcVar2;
  
  if (maxcount <= mincount) {
    maxcount = mincount;
  }
  pcVar2 = "%x";
  if (format != (char *)0x0) {
    pcVar2 = format;
  }
  paVar1 = (arg_date *)argtable3_xcalloc(1,(long)maxcount * 0x38 + 0x78);
  (paVar1->hdr).flag = '\x02';
  (paVar1->hdr).shortopts = shortopts;
  (paVar1->hdr).longopts = longopts;
  if (datatype == (char *)0x0) {
    datatype = pcVar2;
  }
  (paVar1->hdr).datatype = datatype;
  (paVar1->hdr).glossary = glossary;
  (paVar1->hdr).mincount = mincount;
  (paVar1->hdr).maxcount = maxcount;
  (paVar1->hdr).parent = paVar1;
  (paVar1->hdr).resetfn = arg_date_resetfn;
  (paVar1->hdr).scanfn = arg_date_scanfn;
  (paVar1->hdr).checkfn = arg_date_checkfn;
  (paVar1->hdr).errorfn = arg_date_errorfn;
  paVar1->tmval = (tm *)(paVar1 + 1);
  paVar1->count = 0;
  paVar1->format = pcVar2;
  return paVar1;
}

Assistant:

struct arg_date*
arg_daten(const char* shortopts, const char* longopts, const char* format, const char* datatype, int mincount, int maxcount, const char* glossary) {
    size_t nbytes;
    struct arg_date* result;

    /* foolproof things by ensuring maxcount is not less than mincount */
    maxcount = (maxcount < mincount) ? mincount : maxcount;

    /* default time format is the national date format for the locale */
    if (!format)
        format = "%x";

    nbytes = sizeof(struct arg_date)         /* storage for struct arg_date */
             + (size_t)maxcount * sizeof(struct tm); /* storage for tmval[maxcount] array */

    /* allocate storage for the arg_date struct + tmval[] array.    */
    /* we use calloc because we want the tmval[] array zero filled. */
    result = (struct arg_date*)xcalloc(1, nbytes);

    /* init the arg_hdr struct */
    result->hdr.flag = ARG_HASVALUE;
    result->hdr.shortopts = shortopts;
    result->hdr.longopts = longopts;
    result->hdr.datatype = datatype ? datatype : format;
    result->hdr.glossary = glossary;
    result->hdr.mincount = mincount;
    result->hdr.maxcount = maxcount;
    result->hdr.parent = result;
    result->hdr.resetfn = (arg_resetfn*)arg_date_resetfn;
    result->hdr.scanfn = (arg_scanfn*)arg_date_scanfn;
    result->hdr.checkfn = (arg_checkfn*)arg_date_checkfn;
    result->hdr.errorfn = (arg_errorfn*)arg_date_errorfn;

    /* store the tmval[maxcount] array immediately after the arg_date struct */
    result->tmval = (struct tm*)(result + 1);

    /* init the remaining arg_date member variables */
    result->count = 0;
    result->format = format;

    ARG_TRACE(("arg_daten() returns %p\n", result));
    return result;
}